

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Base64Encoding.cpp
# Opt level: O1

size_t axl::enc::Base64Encoding::encode(String *string,void *p,size_t size,uint_t flags)

{
  byte *pbVar1;
  BufHdr *pBVar2;
  char *__s;
  char *pcVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  size_t length;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  
  if (size == 0) {
    pBVar2 = (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
    if (pBVar2 != (BufHdr *)0x0) {
      if ((pBVar2->super_RefCount).m_refCount == 1) {
        (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
             (C *)(pBVar2 + 1);
        *(undefined1 *)&pBVar2[1].super_RefCount._vptr_RefCount = 0;
        (string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
      }
      else {
        sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                  (&string->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
      }
    }
    return 0;
  }
  lVar9 = (ulong)(0x2aaaaaaaaaaaaaaa < size * 0x5555555555555558 >> 1) + (size * 8) / 6;
  uVar5 = 0;
  if ((flags & 1) == 0) {
    uVar5 = (ulong)(-(int)lVar9 & 3);
  }
  length = uVar5 + lVar9;
  if ((flags & 8) != 0) {
    length = ((length >> 6) + length) - (ulong)((length & 0xfc0) == 0);
  }
  __s = sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer(string,length,false);
  if (__s == (C *)0x0) {
    return 0xffffffffffffffff;
  }
  pcVar8 = __s + length;
  pbVar1 = (byte *)((long)p + size);
  if ((flags & 8) == 0) {
    if ((flags & 2) == 0) {
      if ((long)size < 1) {
        uVar10 = 0;
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        uVar10 = 0;
        do {
          uVar10 = (uint)*p | uVar10 << 8;
          uVar5 = uVar5 + 8;
          do {
            uVar5 = uVar5 - 6;
            *__s = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [uVar10 >> ((byte)uVar5 & 0x1f) & 0x3f];
            __s = __s + 1;
          } while (5 < uVar5);
          p = (void *)((long)p + 1);
        } while (p < pbVar1);
      }
      if (uVar5 == 0) goto LAB_00143478;
      uVar10 = uVar10 << (6U - (char)uVar5 & 0x1f);
      pcVar7 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
    }
    else {
      if ((long)size < 1) {
        uVar10 = 0;
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        uVar10 = 0;
        do {
          uVar10 = (uint)*p | uVar10 << 8;
          uVar5 = uVar5 + 8;
          do {
            uVar5 = uVar5 - 6;
            *__s = GetBase64UrlChar::operator()(unsigned_char)::charTable
                   [uVar10 >> ((byte)uVar5 & 0x1f) & 0x3f];
            __s = __s + 1;
          } while (5 < uVar5);
          p = (void *)((long)p + 1);
        } while (p < pbVar1);
      }
      if (uVar5 == 0) goto LAB_00143478;
      uVar10 = uVar10 << (6U - (char)uVar5 & 0x1f);
      pcVar7 = GetBase64UrlChar::operator()(unsigned_char)::charTable;
    }
    cVar4 = pcVar7[uVar10 & 0x3f];
  }
  else {
    if ((flags & 2) == 0) {
      pcVar7 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
      if ((long)size < 1) {
LAB_00143417:
        uVar10 = 0;
        uVar5 = 0;
      }
      else {
        uVar11 = 0;
        uVar5 = 0;
        uVar10 = 0;
        do {
          uVar10 = (uint)*p | uVar10 << 8;
          uVar6 = uVar5 + 8;
          do {
            bVar12 = (uVar11 & 0x3f) == 0;
            if (bVar12) {
              *__s = '\n';
            }
            uVar5 = uVar6 - 6;
            pcVar3 = __s + bVar12;
            __s = pcVar3 + 1;
            *pcVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [uVar10 >> ((char)uVar6 - 6U & 0x1f) & 0x3f];
            uVar11 = uVar11 + 1;
            uVar6 = uVar5;
          } while (5 < uVar5);
          p = (void *)((long)p + 1);
        } while (p < pbVar1);
      }
    }
    else {
      pcVar7 = GetBase64UrlChar::operator()(unsigned_char)::charTable;
      if ((long)size < 1) goto LAB_00143417;
      uVar11 = 0;
      uVar5 = 0;
      uVar10 = 0;
      do {
        uVar10 = (uint)*p | uVar10 << 8;
        uVar6 = uVar5 + 8;
        do {
          bVar12 = (uVar11 & 0x3f) == 0;
          if (bVar12) {
            *__s = '\n';
          }
          uVar5 = uVar6 - 6;
          pcVar3 = __s + bVar12;
          __s = pcVar3 + 1;
          *pcVar3 = GetBase64UrlChar::operator()(unsigned_char)::charTable
                    [uVar10 >> ((char)uVar6 - 6U & 0x1f) & 0x3f];
          uVar11 = uVar11 + 1;
          uVar6 = uVar5;
        } while (5 < uVar5);
        p = (void *)((long)p + 1);
      } while (p < pbVar1);
    }
    if (uVar5 == 0) goto LAB_00143478;
    cVar4 = pcVar7[uVar10 << (6U - (char)uVar5 & 0x1f) & 0x3f];
  }
  *__s = cVar4;
  __s = __s + 1;
LAB_00143478:
  if (__s < pcVar8) {
    memset(__s,0x3d,(long)pcVar8 - (long)__s);
  }
  return length;
}

Assistant:

size_t
Base64Encoding::encode(
	sl::String* string,
	const void* p,
	size_t size,
	uint_t flags
) {
	if (!size) {
		string->clear();
		return 0;
	}

	size_t bitCount = size * 8;
	size_t length = bitCount / 6;
	if (bitCount % 6)
		length++;

	if (!(flags & Base64EncodingFlag_NoPadding))
		length += 3 - ((length - 1) & 3);

	if (flags & Base64EncodingFlag_Multiline) {
		size_t lineCount = length / 64;
		if (lineCount & 0x3f)
			lineCount++;

		length += lineCount - 1;
	}

	char* dst = string->createBuffer(length);
	if (!dst)
		return -1;

	if (flags & Base64EncodingFlag_Multiline) {
		if (flags & Base64EncodingFlag_UrlChars)
			encodeImpl<GetBase64UrlChar, InsertNl>(dst, length, (uchar_t*)p, size);
		else
			encodeImpl<GetBase64Char, InsertNl>(dst, length, (uchar_t*)p, size);
	} else {
		if (flags & Base64EncodingFlag_UrlChars)
			encodeImpl<GetBase64UrlChar, InsertNoNl>(dst, length, (uchar_t*)p, size);
		else
			encodeImpl<GetBase64Char, InsertNoNl>(dst, length, (uchar_t*)p, size);
	}

	return length;
}